

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scala_scl.cpp
# Opt level: O0

scale * scala::read_scl(scale *__return_storage_ptr__,ifstream *input_file)

{
  bool bVar1;
  int d;
  int iVar2;
  const_reference this;
  degree *pdVar3;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_208;
  double local_1e8;
  string_type local_1e0;
  string_type local_1c0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1a0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_180;
  double local_160;
  double local_158;
  double cents;
  undefined4 local_12c;
  undefined1 local_128 [8];
  string entry;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_e8;
  undefined1 local_c8 [8];
  regex COMMENT_REGEX;
  undefined1 local_a0 [6];
  bool description_parsed;
  smatch trimmed;
  undefined1 local_70 [8];
  smatch match;
  string buffer;
  int denominator;
  int numerator;
  unsigned_long entries;
  int non_commnets_processed;
  ifstream *input_file_local;
  scale *scala_scale;
  
  entries._4_4_ = 0;
  std::__cxx11::string::string((string *)&match._M_begin);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_70);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_a0);
  COMMENT_REGEX._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._7_1_ = 0;
  scale::scale(__return_storage_ptr__);
  COMMENT_REGEX._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._6_1_ = 0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c8,"[ \t]*!.*",0x10);
  while (bVar1 = std::ios::operator_cast_to_bool
                           ((ios *)(input_file + *(long *)(*(long *)input_file + -0x18))), bVar1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)input_file,(string *)&match._M_begin);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &match._M_begin,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c8,0);
    if (!bVar1) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_e8,"[ \t]*",0x10);
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &match._M_begin,&local_e8,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_e8);
      if (bVar1) {
        if (entries._4_4_ == 0) {
          COMMENT_REGEX._M_automaton.
          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._6_1_ = 1;
        }
        entries._4_4_ = entries._4_4_ + 1;
      }
      else {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                   ((long)&entry.field_2 + 8),"([ \t]*)([^ \t]*)(.*)",0x10);
        std::
        regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &match._M_begin,
                   (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_a0,
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                   ((long)&entry.field_2 + 8),0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                   ((long)&entry.field_2 + 8));
        this = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_a0,2);
        std::__cxx11::sub_match::operator_cast_to_string((string_type *)local_128,(sub_match *)this)
        ;
        if (entries._4_4_ == 0) {
          entries._4_4_ = 1;
          COMMENT_REGEX._M_automaton.
          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._6_1_ = 1;
          local_12c = 2;
        }
        else if (entries._4_4_ == 1) {
          std::__cxx11::stoul((string *)local_128,(size_t *)0x0,10);
          entries._4_4_ = 2;
          local_12c = 2;
        }
        else {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&cents,".*[.]+.*",0x10)
          ;
          bVar1 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128,
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&cents,0);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&cents);
          if (bVar1) {
            local_158 = std::__cxx11::stod((string *)local_128,(size_t *)0x0);
            pdVar3 = (degree *)operator_new(8);
            degree::degree(pdVar3,local_158);
            local_160 = pdVar3->ratio;
            scale::add_degree(__return_storage_ptr__,(degree)local_160);
          }
          else {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      (&local_180,".*[/]{1}.*",0x10);
            bVar1 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_128,&local_180,0);
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      (&local_180);
            if (bVar1) {
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        (&local_1a0,"(.*)/(.*)",0x10);
              std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_70,&local_1a0,0);
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                        (&local_1a0);
              std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::str(&local_1c0,
                    (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_70,1);
              iVar2 = std::__cxx11::stoi(&local_1c0,(size_t *)0x0,10);
              std::__cxx11::string::~string((string *)&local_1c0);
              std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::str(&local_1e0,
                    (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_70,2);
              d = std::__cxx11::stoi(&local_1e0,(size_t *)0x0,10);
              std::__cxx11::string::~string((string *)&local_1e0);
              pdVar3 = (degree *)operator_new(8);
              degree::degree(pdVar3,iVar2,d);
              local_1e8 = pdVar3->ratio;
              scale::add_degree(__return_storage_ptr__,(degree)local_1e8);
            }
            else {
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        (&local_208,"[0-9]*",0x10);
              bVar1 = std::
                      regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_128,&local_208,0);
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                        (&local_208);
              if (bVar1) {
                iVar2 = std::__cxx11::stoi((string *)local_128,(size_t *)0x0,10);
                pdVar3 = (degree *)operator_new(8);
                degree::degree(pdVar3,iVar2,1);
                scale::add_degree(__return_storage_ptr__,(degree)pdVar3->ratio);
              }
            }
          }
          local_12c = 0;
        }
        std::__cxx11::string::~string((string *)local_128);
      }
    }
  }
  COMMENT_REGEX._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._7_1_ = 1;
  local_12c = 1;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c8);
  if ((COMMENT_REGEX._M_automaton.
       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._7_1_ & 1) == 0) {
    scale::~scale(__return_storage_ptr__);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_a0);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_70);
  std::__cxx11::string::~string((string *)&match._M_begin);
  return __return_storage_ptr__;
}

Assistant:

scale read_scl(std::ifstream& input_file){ 
        /* 
        C++ Code to parse the Scala scale file, as documented here:

            http://www.huygens-fokker.org/scala/scl_format.html

        A couple of extensions:

        - Allow white-space before the comment character.  Spec is a little ambiguous.
        - Allow blank lines. In the standard only the scale name is mentioned as potentially blank.
        */
        
        int non_commnets_processed = 0;
        unsigned long entries = 0;
        int numerator, denominator;
        std::string buffer;
        std::smatch match, trimmed;
        scale scala_scale;
        bool description_parsed = false ;

#ifdef SCALA_STRICT
        std::regex COMMENT_REGEX = std::regex("^!.*");
#else
        std::regex COMMENT_REGEX = std::regex("[ \t]*!.*");
#endif

        while (input_file) {
            getline(input_file, buffer);
            if (std::regex_match (buffer, COMMENT_REGEX)) {
                // We're defining a comment as the first non-whitespace character being a "!".
            } else if (std::regex_match (buffer, std::regex("[ \t]*") )) {
                // Blank line. Discard. This may be an extension of the format.
#ifdef SCALA_STRICT
                if (description_parsed) {
                    // If we're at a blank line which is not the description, assume it's 
                    // a final linefeed at the end of the file.
                    break;
                }
#endif
                if (non_commnets_processed == 0){
                    description_parsed = true;
                }

                non_commnets_processed = non_commnets_processed + 1;

            } else {
                // Extract the part after optional leading whitespace and before an optional space and label
                std::regex_search(buffer, trimmed, std::regex("([ \t]*)([^ \t]*)(.*)"));
                std::string entry = trimmed[2];
                if (non_commnets_processed == 0) {
                    // First non-comment is the description. Can be ignored
                    non_commnets_processed = non_commnets_processed + 1;
                    description_parsed = true;
                    continue;
                }
                else if (non_commnets_processed == 1){
                    // Second non-comment line containers the number of entries.
                    entries  = std::stoul(entry);
                    non_commnets_processed = non_commnets_processed + 1;
                    continue;
                }
                else if (std::regex_match (entry, std::regex(".*[.]+.*") )) {
                    // Cent values *must* have a period. It's the law.
                    double cents = std::stod(entry);
                    scala_scale.add_degree(*new degree(cents));
                }
                else if (std::regex_match (entry, std::regex(".*[/]{1}.*") )) {
                    // A ratio
                    std::regex_search(entry, match, std::regex("(.*)/(.*)"));
                    numerator = std::stoi(match.str(1)); 
                    denominator = std::stoi(match.str(2)); 
                    scala_scale.add_degree(*new degree(numerator, denominator));
                } else if (std::regex_match (entry, std::regex("[0-9]*") )) {
                    // According to the standard, single numbers should be treated as ratios
                    numerator = std::stoi(entry); 
                    denominator = 1;
                    scala_scale.add_degree(*new degree(numerator, denominator));
                }
#ifdef SCALA_STRICT
                else {
                    // In strict mode we'll make sure to throw an error if the line
                    // can't be interpreted.  In lax mode we just give up and move on.
                    std::string message = "Scala parse error: cannot interpret: ";
                    throw std::runtime_error(message.append(buffer));
                }
#endif
            }
        }
        
#ifdef SCALA_STRICT
        if (scala_scale.get_scale_length() != entries + 1){
            // If we make is here one of the entries probably didn't parse, but it wasn't
            // such that an error was thrown.  Strict adherence says you should throw an 
            // error on all file parse errors.
            throw std::runtime_error("Scala file parse error: Unexpected number of entries");
        }
#endif
        
        return scala_scale;
    }